

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O2

hbtrie_result hbtrie_find_offset(hbtrie *trie,void *rawkey,int rawkeylen,void *valuebuf)

{
  byte bVar1;
  undefined8 uVar2;
  long lVar3;
  int keylen;
  hbtrie_result hVar4;
  undefined8 uStack_30;
  undefined1 auStack_28 [8];
  
  bVar1 = trie->chunksize;
  lVar3 = -(((long)((int)(rawkeylen + (uint)bVar1 + -1) / (int)(uint)bVar1) + 1) * (ulong)bVar1 +
            0xf & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x12722c;
  keylen = _hbtrie_reform_key(trie,rawkey,rawkeylen,auStack_28 + lVar3);
  *(undefined8 *)((long)&uStack_30 + lVar3) = 1;
  uVar2 = *(undefined8 *)((long)&uStack_30 + lVar3);
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x127243;
  hVar4 = _hbtrie_find(trie,auStack_28 + lVar3,keylen,valuebuf,(list *)0x0,(uint8_t)uVar2);
  return hVar4;
}

Assistant:

hbtrie_result hbtrie_find_offset(struct hbtrie *trie, void *rawkey,
                                 int rawkeylen, void *valuebuf)
{
    int nchunk = _get_nchunk_raw(trie, rawkey, rawkeylen);
    uint8_t *key = alca(uint8_t, nchunk * trie->chunksize);
    int keylen;

    keylen = _hbtrie_reform_key(trie, rawkey, rawkeylen, key);
    return _hbtrie_find(trie, key, keylen, valuebuf, NULL,
                        HBTRIE_PREFIX_MATCH_ONLY);
}